

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputfile.cpp
# Opt level: O0

void __thiscall OutputFile::~OutputFile(OutputFile *this)

{
  int in_ESI;
  OutputFile *this_local;
  
  close(this,in_ESI);
  std::ifstream::~ifstream(&this->freader);
  std::ofstream::~ofstream(&this->fwriter);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

OutputFile::~OutputFile()
{
    close();
}